

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall
Component_isNotDefinedWithUndefinedUnits_Test::~Component_isNotDefinedWithUndefinedUnits_Test
          (Component_isNotDefinedWithUndefinedUnits_Test *this)

{
  Component_isNotDefinedWithUndefinedUnits_Test *this_local;
  
  ~Component_isNotDefinedWithUndefinedUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, isNotDefinedWithUndefinedUnits)
{
    libcellml::ComponentPtr c = libcellml::Component::create("a_component");
    libcellml::VariablePtr v = libcellml::Variable::create("a_variable");
    libcellml::UnitsPtr u = libcellml::Units::create("improper_units");
    u->addUnit("battle");

    c->addVariable(v);
    v->setUnits(u);

    EXPECT_FALSE(c->isDefined());
}